

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int selective_disable_cdf_rtc(AV1_COMP *cpi)

{
  int iVar1;
  AV1_COMP *in_RDI;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  uint local_4;
  
  if (((in_RDI->svc).number_spatial_layers == 1) && ((in_RDI->svc).number_temporal_layers == 1)) {
    iVar1 = frame_is_intra_only(&in_RDI->common);
    if (((((iVar1 == 0) && (iVar1 = is_frame_resize_pending(in_RDI), iVar1 == 0)) &&
         ((in_RDI->rc).high_source_sad == 0)) &&
        ((0x1d < (in_RDI->rc).frames_since_key &&
         (((in_RDI->oxcf).q_cfg.aq_mode != '\x03' ||
          (0x1d < in_RDI->cyclic_refresh->counter_encode_maxq_scene_change)))))) &&
       ((in_RDI->frames_since_last_update < 9 || ((in_RDI->rc).frame_source_sad == 0)))) {
      return 1;
    }
    local_4 = 0;
  }
  else if ((in_RDI->svc).number_temporal_layers < 2) {
    local_4 = 1;
  }
  else {
    local_4 = (uint)((in_RDI->svc).temporal_layer_id == (in_RDI->svc).number_temporal_layers + -1);
  }
  return local_4;
}

Assistant:

static inline int selective_disable_cdf_rtc(const AV1_COMP *cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  const RATE_CONTROL *const rc = &cpi->rc;
  // For single layer.
  if (cpi->svc.number_spatial_layers == 1 &&
      cpi->svc.number_temporal_layers == 1) {
    // Don't disable on intra_only, scene change (high_source_sad = 1),
    // or resized frame. To avoid quality loss force enable at
    // for ~30 frames after key or scene/slide change, and
    // after 8 frames since last update if frame_source_sad > 0.
    if (frame_is_intra_only(cm) || is_frame_resize_pending(cpi) ||
        rc->high_source_sad || rc->frames_since_key < 30 ||
        (cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ &&
         cpi->cyclic_refresh->counter_encode_maxq_scene_change < 30) ||
        (cpi->frames_since_last_update > 8 && cpi->rc.frame_source_sad > 0))
      return 0;
    else
      return 1;
  } else if (cpi->svc.number_temporal_layers > 1) {
    // Disable only on top temporal enhancement layer for now.
    return cpi->svc.temporal_layer_id == cpi->svc.number_temporal_layers - 1;
  }
  return 1;
}